

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

void __thiscall
bench::show_to_console
          (bench *this,vector<bench::element,_std::allocator<bench::element>_> *current,string *name
          )

{
  ulong uVar1;
  pointer psVar2;
  pointer psVar3;
  pointer pdVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  pointer pmVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  pointer pmVar11;
  pointer pmVar12;
  pointer peVar13;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar14;
  size_type sVar15;
  long lVar16;
  size_type __n;
  size_t end_solver;
  long lVar17;
  long lVar18;
  pointer pmVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 extraout_var [56];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  pointer psVar26;
  undefined1 auVar27 [64];
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  string_view format_str_04;
  string_view format_str_05;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_05;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_06;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_07;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_08;
  vector<int,_std::allocator<int>_> row_length;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined1 local_b4;
  undefined2 local_b0;
  undefined1 local_ae;
  pointer local_a8;
  ulong uStack_a0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_98;
  pointer local_88;
  pointer local_80;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_78;
  pointer local_70;
  pointer local_68;
  vector<bench::element,_std::allocator<bench::element>_> *local_60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_58 [2];
  long local_48;
  string *local_40;
  ulong local_38;
  undefined1 extraout_var_00 [56];
  
  pmVar12 = (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pmVar19 = (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>._M_impl.
            super__Vector_impl_data._M_start;
  psVar2 = (this->solvers).super__Vector_base<bench::solver,_std::allocator<bench::solver>_>._M_impl
           .super__Vector_impl_data._M_finish;
  local_68 = (pointer)(((long)pmVar12 - (long)pmVar19 >> 3) * -0x3333333333333333);
  local_80 = (this->solvers).super__Vector_base<bench::solver,_std::allocator<bench::solver>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_a8 = (pointer)CONCAT44(local_a8._4_4_,5);
  __n = (long)psVar2 - (long)local_80 >> 5;
  local_60 = current;
  local_40 = name;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_58,__n,(value_type_conflict3 *)&local_a8,
             (allocator_type *)&local_c0);
  local_78 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
              )0xa;
  local_88 = pmVar19;
  aVar14 = local_78;
  local_70 = pmVar12;
  if (pmVar12 != pmVar19) {
    lVar18 = 0;
    pmVar12 = (pointer)0x0;
    do {
      if (psVar2 != local_80) {
        sVar15 = 0;
        do {
          uVar1 = *(ulong *)((long)(this->array).m_data.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start +
                            sVar15 * 8 + (this->array).m_line_size * lVar18);
          if ((uVar1 & 0x7fffffffffffffff) != 0x7ff0000000000000) {
            auVar20._8_8_ = 0x7fffffffffffffff;
            auVar20._0_8_ = 0x7fffffffffffffff;
            auVar21._8_8_ = 0;
            auVar21._0_8_ = uVar1;
            auVar20 = vpandq_avx512vl(auVar21,auVar20);
            auVar27._0_8_ = log10(auVar20._0_8_);
            auVar27._8_56_ = extraout_var;
            auVar20 = vroundsd_avx(auVar27._0_16_,auVar27._0_16_,9);
            iVar8 = (int)auVar20._0_8_ + 5;
            if (*(int *)((long)&(local_58[0].values_)->field_0 + sVar15 * 4) < iVar8) {
              *(int *)((long)&(local_58[0].values_)->field_0 + sVar15 * 4) = iVar8;
            }
          }
          sVar15 = sVar15 + 1;
        } while (__n != sVar15);
      }
      pmVar12 = (pointer)((long)&(pmVar12->m_name)._M_dataplus._M_p + 1);
      lVar18 = lVar18 + 8;
    } while (pmVar12 != local_68);
    aVar14 = local_78;
    if (local_70 != local_88) {
      aVar14 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                )0xa;
      lVar18 = 8;
      pmVar12 = local_68;
      do {
        peVar13 = (local_60->super__Vector_base<bench::element,_std::allocator<bench::element>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if ((*(char *)((long)&peVar13->solution + lVar18) == '\x01') &&
           (uVar1 = *(ulong *)((long)peVar13 + lVar18 + -8),
           (uVar1 & 0x7fffffffffffffff) != 0x7ff0000000000000)) {
          auVar5._8_8_ = 0x7fffffffffffffff;
          auVar5._0_8_ = 0x7fffffffffffffff;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = uVar1;
          auVar20 = vpandq_avx512vl(auVar22,auVar5);
          auVar24._0_8_ = log10(auVar20._0_8_);
          auVar24._8_56_ = extraout_var_00;
          auVar20 = vroundsd_avx(auVar24._0_16_,auVar24._0_16_,9);
          uVar9 = (int)auVar20._0_8_ + 5;
          if (aVar14._0_4_ < (int)uVar9) {
            aVar14._4_4_ = 0;
            aVar14._0_4_ = uVar9;
          }
        }
        lVar18 = lVar18 + 0x10;
        pmVar12 = (pointer)&pmVar12[-1].field_0x27;
      } while (pmVar12 != (pointer)0x0);
    }
  }
  local_78 = aVar14;
  pmVar12 = (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>._M_impl.
            super__Vector_impl_data._M_start;
  pmVar19 = (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pmVar11 = pmVar12 + 1;
  if (pmVar11 != pmVar19 && pmVar12 != pmVar19) {
    do {
      pmVar7 = pmVar11;
      if ((pmVar11->m_name)._M_string_length <= (pmVar12->m_name)._M_string_length) {
        pmVar7 = pmVar12;
      }
      pmVar12 = pmVar7;
      pmVar11 = pmVar11 + 1;
    } while (pmVar11 != pmVar19);
  }
  uVar1 = (pmVar12->m_name)._M_string_length;
  local_a8 = "file";
  local_98 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
              )4;
  if (4 < uVar1) {
    local_98 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                )uVar1;
  }
  format_str.size_ = 9;
  format_str.data_ = "{:^{}} | ";
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       &local_a8;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = 0x4c;
  local_38 = (ulong)local_98;
  ::fmt::v7::vprint(_stdout,format_str,args);
  if (psVar2 != local_80) {
    lVar18 = 0;
    do {
      psVar2 = (this->solvers).super__Vector_base<bench::solver,_std::allocator<bench::solver>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_a8 = (&(psVar2->m_name)._M_dataplus)[lVar18]._M_p;
      uStack_a0 = (&(psVar2->m_name)._M_string_length)[lVar18];
      local_98 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                  )(ulong)*(uint *)((long)&(local_58[0].values_)->field_0 + lVar18);
      if (9 < uStack_a0) {
        uStack_a0 = 10;
      }
      format_str_00.size_ = 7;
      format_str_00.data_ = "{:>{}} ";
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           &local_a8;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = 0x1d;
      ::fmt::v7::vprint(_stdout,format_str_00,args_00);
      lVar18 = lVar18 + 4;
      __n = __n - 1;
    } while (__n != 0);
  }
  local_a8 = (local_40->_M_dataplus)._M_p;
  uStack_a0 = local_40->_M_string_length;
  local_98.args_ = local_78.args_;
  format_str_01.size_ = 7;
  format_str_01.data_ = "{:>{}}\n";
  args_01.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       &local_a8;
  args_01.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = 0x1d;
  ::fmt::v7::vprint(_stdout,format_str_01,args_01);
  if (local_70 != local_88) {
    lVar18 = 0;
    pmVar12 = (pointer)0x0;
    do {
      pmVar19 = (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>.
                _M_impl.super__Vector_impl_data._M_start + (long)pmVar12;
      local_a8 = (pmVar19->m_name)._M_dataplus._M_p;
      uStack_a0 = (pmVar19->m_name)._M_string_length;
      local_98 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                  )local_38;
      format_str_02.size_ = 9;
      format_str_02.data_ = "{:^{}} | ";
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ =
           (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
           &local_a8;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = 0x4d;
      ::fmt::v7::vprint(_stdout,format_str_02,args_02);
      auVar27 = ZEXT1664(ZEXT816(0x7fefffffffffffff));
      pmVar19 = (pointer)0xffefffffffffffff;
      psVar2 = (this->solvers).super__Vector_base<bench::solver,_std::allocator<bench::solver>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      psVar3 = (this->solvers).super__Vector_base<bench::solver,_std::allocator<bench::solver>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar17 = (long)psVar2 - (long)psVar3 >> 5;
      if (psVar2 != psVar3) {
        auVar27 = ZEXT1664(ZEXT816(0x7fefffffffffffff));
        lVar16 = 0;
        pmVar11 = (pointer)0xffefffffffffffff;
        do {
          pmVar19 = *(pointer *)
                     ((long)(this->array).m_data.super__Vector_base<double,_std::allocator<double>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                     lVar16 * 8 + (this->array).m_line_size * lVar18);
          if (ABS((double)pmVar19) == INFINITY) {
LAB_00133d11:
            pmVar19 = pmVar11;
          }
          else {
            auVar23._8_8_ = 0;
            auVar23._0_8_ = pmVar19;
            auVar20 = vminsd_avx(auVar23,auVar27._0_16_);
            auVar27 = ZEXT1664(auVar20);
            if ((double)pmVar19 <= (double)pmVar11) goto LAB_00133d11;
          }
          lVar16 = lVar16 + 1;
          pmVar11 = pmVar19;
        } while (lVar17 != lVar16);
      }
      peVar13 = (local_60->super__Vector_base<bench::element,_std::allocator<bench::element>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((peVar13[(long)pmVar12].success == false) ||
         (pmVar11 = (pointer)peVar13[(long)pmVar12].solution, ABS((double)pmVar11) == INFINITY)) {
LAB_00133d63:
        pmVar11 = pmVar19;
      }
      else {
        auVar25._8_8_ = 0;
        auVar25._0_8_ = pmVar11;
        auVar20 = vminsd_avx(auVar25,auVar27._0_16_);
        auVar27 = ZEXT1664(auVar20);
        if ((double)pmVar11 <= (double)pmVar19) goto LAB_00133d63;
      }
      pmVar19 = pmVar12;
      psVar26 = auVar27._0_8_;
      if (psVar2 != psVar3) {
        lVar16 = 0;
        local_88 = pmVar11;
        local_80 = auVar27._0_8_;
        local_70 = pmVar12;
        do {
          lVar10 = (this->array).m_line_size * lVar18;
          pdVar4 = (this->array).m_data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_a8 = *(pointer *)((long)pdVar4 + lVar16 * 8 + lVar10);
          if (((double)local_a8 != auVar27._0_8_) || (NAN((double)local_a8) || NAN(auVar27._0_8_)))
          {
            if (((double)local_a8 != (double)local_88) ||
               (NAN((double)local_a8) || NAN((double)local_88))) {
              local_98 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                          )(ulong)*(uint *)((long)&(local_58[0].values_)->field_0 + lVar16 * 4);
              format_str_03.size_ = 10;
              format_str_03.data_ = "{:>{}.3f} ";
              args_03.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .field_1.values_ =
                   (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)&local_a8;
              args_03.
              super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              .desc_ = 0x1a;
              ::fmt::v7::vprint(_stdout,format_str_03,args_03);
            }
            else {
              local_b8 = 0;
              local_b4 = 0;
              local_ae = 0;
              local_c0 = 0xff00000001;
              local_b0 = 1;
              local_a8 = *(pointer *)((long)pdVar4 + lVar16 * 8 + lVar10);
              local_98 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                          )(ulong)*(uint *)((long)&(local_58[0].values_)->field_0 + lVar16 * 4);
              args_06.field_1.values_ = local_58[0].values_;
              args_06.desc_ = (unsigned_long_long)&local_a8;
              ::fmt::v7::vprint<char[11],char>
                        ((v7 *)_stdout,(FILE *)&local_c0,(text_style *)"{:>{}.3f} ",
                         (char (*) [11])0x1a,args_06);
            }
          }
          else {
            local_b8 = 0;
            local_b4 = 0;
            local_ae = 0;
            local_c0 = 0x800000000001;
            local_b0 = 1;
            local_a8 = *(pointer *)((long)pdVar4 + lVar16 * 8 + lVar10);
            local_98 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                        )(ulong)*(uint *)((long)&(local_58[0].values_)->field_0 + lVar16 * 4);
            args_05.field_1.values_ = local_58[0].values_;
            args_05.desc_ = (unsigned_long_long)&local_a8;
            ::fmt::v7::vprint<char[11],char>
                      ((v7 *)_stdout,(FILE *)&local_c0,(text_style *)"{:>{}.3f} ",
                       (char (*) [11])0x1a,args_05);
          }
          auVar27 = ZEXT864(local_80);
          lVar16 = lVar16 + 1;
        } while (lVar17 != lVar16);
        peVar13 = (local_60->super__Vector_base<bench::element,_std::allocator<bench::element>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pmVar19 = local_70;
        psVar26 = local_80;
        pmVar11 = local_88;
      }
      local_a8 = (pointer)peVar13[(long)pmVar12].solution;
      if (((double)local_a8 != (double)psVar26) || (NAN((double)local_a8) || NAN((double)psVar26)))
      {
        if (((double)local_a8 != (double)pmVar11) || (NAN((double)local_a8) || NAN((double)pmVar11))
           ) {
          local_98.args_ = local_78.args_;
          format_str_04.size_ = 10;
          format_str_04.data_ = "{:>{}.3f} ";
          args_04.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ =
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&local_a8;
          args_04.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = 0x1a;
          ::fmt::v7::vprint(_stdout,format_str_04,args_04);
        }
        else {
          local_b8 = 0;
          local_b4 = 0;
          local_ae = 0;
          local_c0 = 0xff00000001;
          local_b0 = 1;
          local_a8 = (pointer)peVar13[(long)pmVar12].solution;
          local_98.args_ = local_78.args_;
          args_08.field_1.values_ = local_78.values_;
          args_08.desc_ = (unsigned_long_long)&local_a8;
          ::fmt::v7::vprint<char[11],char>
                    ((v7 *)_stdout,(FILE *)&local_c0,(text_style *)"{:>{}.3f} ",(char (*) [11])0x1a,
                     args_08);
        }
      }
      else {
        local_b8 = 0;
        local_b4 = 0;
        local_ae = 0;
        local_c0 = 0x800000000001;
        local_b0 = 1;
        local_a8 = (pointer)peVar13[(long)pmVar12].solution;
        local_98.args_ = local_78.args_;
        args_07.field_1.values_ = local_78.values_;
        args_07.desc_ = (unsigned_long_long)&local_a8;
        ::fmt::v7::vprint<char[11],char>
                  ((v7 *)_stdout,(FILE *)&local_c0,(text_style *)"{:>{}.3f} ",(char (*) [11])0x1a,
                   args_07);
      }
      local_a8 = (pointer)0x0;
      format_str_05.size_ = 1;
      format_str_05.data_ = "\n";
      auVar6._8_8_ = 0;
      auVar6._0_8_ = &local_a8;
      ::fmt::v7::vprint(_stdout,format_str_05,(format_args)(auVar6 << 0x40));
      pmVar12 = (pointer)((long)&(pmVar19->m_name)._M_dataplus._M_p + 1);
      lVar18 = lVar18 + 8;
    } while (pmVar12 != local_68);
  }
  if (local_58[0].values_ !=
      (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)0x0) {
    operator_delete(local_58[0].values_,local_48 - (long)local_58[0]);
  }
  return;
}

Assistant:

void show_to_console(const std::vector<element>& current, std::string name)
    {
        const auto model_size{ models.size() };
        const auto solver_size{ solvers.size() };

        std::vector<int> row_length(solvers.size(), 5);
        int current_row_length = { 10 };

        for (size_t i{ 0 }; i != model_size; ++i) {
            for (size_t j{ 0 }; j != solver_size; ++j) {
                if (is_valid(array(i, j))) {
                    auto digits = get_digits_number(array(i, j));

                    if (digits > row_length[j])
                        row_length[j] = digits;
                }
            }
        }

        for (size_t i{ 0 }; i != model_size; ++i) {
            if (current[i].success && is_valid(current[i].solution)) {
                auto digits = get_digits_number(current[i].solution);

                if (digits > current_row_length)
                    current_row_length = digits;
            }
        }

        auto modelname_lenght_max =
          std::max(static_cast<std::string::size_type>(4),
                   std::max_element(models.cbegin(),
                                    models.cend(),
                                    [](const auto& lhs, const auto& rhs) {
                                        return lhs.size() < rhs.size();
                                    })
                     ->size());

        fmt::print("{:^{}} | ", "file", modelname_lenght_max);

        for (std::size_t solver{ 0 }; solver != solver_size; ++solver)
            fmt::print("{:>{}} ",
                       solvers[solver].name().substr(0, 10),
                       row_length[solver]);

        fmt::print("{:>{}}\n", name, current_row_length);

        for (size_t i{ 0 }; i != model_size; ++i) {
            fmt::print("{:^{}} | ", models[i].name(), modelname_lenght_max);

            auto lower = std::numeric_limits<double>::max();
            auto upper = std::numeric_limits<double>::lowest();

            for (std::size_t solver{ 0 }, end_solver(solvers.size());
                 solver != end_solver;
                 ++solver) {
                if (is_valid(array(i, solver)) && lower > array(i, solver))
                    lower = array(i, solver);

                if (is_valid(array(i, solver)) && upper < array(i, solver))
                    upper = array(i, solver);
            }

            if (current[i].success) {
                if (is_valid(current[i].solution) &&
                    lower > current[i].solution)
                    lower = current[i].solution;

                if (is_valid(current[i].solution) &&
                    upper < current[i].solution)
                    upper = current[i].solution;
            }

            for (std::size_t solver{ 0 }, end_solver(solvers.size());
                 solver != end_solver;
                 ++solver) {

                if (array(i, solver) == lower)
                    fmt::print(fg(fmt::color::green),
                               "{:>{}.3f} ",
                               array(i, solver),
                               row_length[solver]);
                else if (array(i, solver) == upper)
                    fmt::print(fg(fmt::color::blue),
                               "{:>{}.3f} ",
                               array(i, solver),
                               row_length[solver]);
                else
                    fmt::print(
                      "{:>{}.3f} ", array(i, solver), row_length[solver]);
            }

            if (current[i].solution == lower)
                fmt::print(fg(fmt::color::green),
                           "{:>{}.3f} ",
                           current[i].solution,
                           current_row_length);
            else if (current[i].solution == upper)
                fmt::print(fg(fmt::color::blue),
                           "{:>{}.3f} ",
                           current[i].solution,
                           current_row_length);
            else
                fmt::print(
                  "{:>{}.3f} ", current[i].solution, current_row_length);

            fmt::print("\n");
        }
    }